

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  ImGuiColumns *columns;
  ImGuiColumnData *pIVar5;
  char *pcVar6;
  char *label_00;
  char *pcVar7;
  int column_n;
  uint uVar8;
  char *pcVar9;
  int n;
  int i;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  ImVector<ImGuiColumnData> *this;
  char *pcVar15;
  char *pcVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  if (window->Active == false) {
    uVar10 = (ulong)window->WasActive;
  }
  else {
    uVar10 = 1;
  }
  bVar4 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar10,window);
  if (!bVar4) {
    return;
  }
  uVar8 = window->Flags;
  NodeDrawList(window,window->DrawList,label_00);
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",(double)(window->Pos).x,
             (double)(window->Pos).y,(double)(window->Size).x,(double)(window->Size).y,
             (double)(window->ContentSize).x,(double)(window->ContentSize).y);
  pcVar7 = "Child ";
  if ((uVar8 >> 0x18 & 1) == 0) {
    pcVar7 = "";
  }
  auVar19._0_4_ = -(uint)((uVar8 & 0x10000000) == 0);
  auVar19._4_4_ = -(uint)((uVar8 & 0x8000000) == 0);
  auVar19._8_4_ = -(uint)((uVar8 & 0x4000000) == 0);
  auVar19._12_4_ = -(uint)((uVar8 & 0x2000000) == 0);
  auVar18._0_4_ = -(uint)((uVar8 & 0x40) == 0);
  auVar18._4_4_ = -(uint)((uVar8 & 0x40000) == 0);
  auVar18._8_4_ = -(uint)((uVar8 & 0x200) == 0);
  auVar18._12_4_ = -(uint)((uVar8 & 0x100) == 0);
  auVar19 = packssdw(auVar18,auVar19);
  auVar19 = packsswb(auVar19,auVar19);
  pcVar6 = "Tooltip ";
  if ((auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar6 = "";
  }
  pcVar11 = "Popup ";
  if ((auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar11 = "";
  }
  pcVar12 = "Modal ";
  if ((auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar12 = "";
  }
  pcVar13 = "ChildMenu ";
  if ((auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar13 = "";
  }
  pcVar14 = "NoSavedSettings ";
  if ((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar14 = "";
  }
  pcVar9 = "NoMouseInputs";
  if ((auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar9 = "";
  }
  pcVar15 = "NoNavInputs";
  if ((auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar15 = "";
  }
  pcVar16 = "AlwaysAutoResize";
  if ((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar16 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar8,pcVar7,pcVar6,pcVar11,pcVar12,
             pcVar13,pcVar14,pcVar9,pcVar15,pcVar16);
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x,
             (double)(window->ScrollMax).x,(double)(window->Scroll).y,(double)(window->ScrollMax).y)
  ;
  if ((window->Active == false) && (window->WasActive == false)) {
    uVar10 = 0xffffffffffffffff;
  }
  else {
    uVar10 = (ulong)(uint)(int)window->BeginOrderWithinContext;
  }
  BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active,
             (ulong)window->WasActive,(ulong)window->WriteAccessed,uVar10);
  BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
             (ulong)window->Appearing,(ulong)window->Hidden,
             (ulong)(uint)window->HiddenFramesCanSkipItems,
             (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar7 = "NULL";
  }
  else {
    pcVar7 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar7);
  fVar1 = window->NavRectRel[0].Min.x;
  fVar17 = window->NavRectRel[0].Max.x;
  if (fVar1 <= fVar17) {
    fVar2 = window->NavRectRel[0].Min.y;
    fVar3 = window->NavRectRel[0].Max.y;
    if (fVar2 <= fVar3) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar2,(double)fVar17,
                 (double)fVar3);
      goto LAB_0011b64c;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_0011b64c:
  if (window->RootWindow != window) {
    NodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    NodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
  }
  if (0 < (window->ColumnsStorage).Size) {
    bVar4 = TreeNode("Columns","Columns sets (%d)");
    if (bVar4) {
      for (i = 0; i < (window->ColumnsStorage).Size; i = i + 1) {
        columns = ImVector<ImGuiColumns>::operator[](&window->ColumnsStorage,i);
        bVar4 = TreeNode((void *)(ulong)columns->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                         (void *)(ulong)columns->ID,(ulong)(uint)columns->Count,
                         (ulong)(uint)columns->Flags);
        if (bVar4) {
          BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                     (double)(columns->OffMaxX - columns->OffMinX),(double)columns->OffMinX,
                     (double)columns->OffMaxX);
          this = &columns->Columns;
          for (uVar8 = 0; (int)uVar8 < this->Size; uVar8 = uVar8 + 1) {
            pIVar5 = ImVector<ImGuiColumnData>::operator[](this,uVar8);
            fVar1 = pIVar5->OffsetNorm;
            pIVar5 = ImVector<ImGuiColumnData>::operator[](this,uVar8);
            fVar17 = GetColumnOffsetFromNorm(columns,pIVar5->OffsetNorm);
            BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar1,(double)fVar17,
                       (ulong)uVar8);
          }
          TreePop();
        }
      }
      TreePop();
    }
  }
  BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
  TreePop();
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y);
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.size_in_bytes());
            ImGui::TreePop();
        }